

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O1

void __thiscall WorldShuffler::randomize_items(WorldShuffler *this)

{
  _Rb_tree_header *p_Var1;
  Json *this_00;
  mapped_type_conflict2 mVar2;
  WorldNode *start_node;
  pointer ppIVar3;
  _Base_ptr p_Var4;
  pointer ppVar5;
  Item *pIVar6;
  pointer ppIVar7;
  bool bVar8;
  mapped_type *ppWVar9;
  WorldNode *end_node;
  mapped_type_conflict2 *pmVar10;
  reference pvVar11;
  _Base_ptr p_Var12;
  _Rb_tree_header *p_Var13;
  WorldSolver *this_01;
  pointer ppIVar14;
  pointer ppIVar15;
  pointer ppVar16;
  ItemSource *source;
  vector<Item_*,_std::allocator<Item_*>_> local_80;
  WorldSolver *local_68;
  map<ItemSource_*,_unsigned_short,_std::less<ItemSource_*>,_std::allocator<std::pair<ItemSource_*const,_unsigned_short>_>_>
  *local_60;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> local_58;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  
  place_fixed_items(this);
  init_item_pool(this);
  this_01 = &this->_solver;
  ppWVar9 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
            ::at(&this->_world->_nodes,&this->_world->_spawn_location->_node_id);
  start_node = *ppWVar9;
  end_node = RandomizerWorld::end_node(this->_world);
  World::starting_inventory(&local_80,&this->_world->super_World);
  WorldSolver::setup(this_01,start_node,end_node,&local_80);
  if ((ItemSource *)
      local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (ItemSource *)0x0) {
    operator_delete(local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_60 = &this->_item_source_spheres;
  p_Var1 = &(this->_item_source_spheres)._M_t._M_impl.super__Rb_tree_header;
  local_68 = this_01;
  do {
    bVar8 = WorldSolver::run_until_blocked(this_01);
    ppIVar3 = (this->_solver)._reachable_item_sources.
              super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppIVar15 = (this->_solver)._reachable_item_sources.
                    super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppIVar15 != ppIVar3; ppIVar15 = ppIVar15 + 1)
    {
      local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*ppIVar15;
      p_Var4 = (this->_item_source_spheres)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var12 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
          p_Var4 = (&p_Var4->_M_left)
                   [*(ItemSource **)(p_Var4 + 1) <
                    local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start]) {
        if (*(ItemSource **)(p_Var4 + 1) >=
            local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          p_Var12 = p_Var4;
        }
      }
      p_Var13 = p_Var1;
      if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
         (p_Var13 = (_Rb_tree_header *)p_Var12,
         local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start <
         (ItemSource *)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
        p_Var13 = p_Var1;
      }
      if (p_Var13 == p_Var1) {
        mVar2 = this->_current_sphere;
        pmVar10 = std::
                  map<ItemSource_*,_unsigned_short,_std::less<ItemSource_*>,_std::allocator<std::pair<ItemSource_*const,_unsigned_short>_>_>
                  ::operator[](local_60,(key_type *)&local_80);
        *pmVar10 = mVar2;
      }
    }
    ppVar5 = (this->_solver)._scheduled_item_placements.
             super__Vector_base<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar16 = (this->_solver)._scheduled_item_placements.
                   super__Vector_base<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar16 != ppVar5;
        ppVar16 = ppVar16 + 1) {
      pIVar6 = ppVar16->first;
      std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::vector(&local_58,&ppVar16->second);
      place_item_randomly(this,pIVar6,&local_58);
      if (local_58.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    open_random_blocked_path(this);
    this_01 = local_68;
    WorldSolver::update_current_inventory(local_68);
    this->_current_sphere = this->_current_sphere + 1;
  } while (bVar8);
  place_remaining_items(this);
  if (this->_options->_archipelago_world == false) {
    this_00 = &(this->_solver)._debug_log;
    WorldSolver::find_minimal_inventory(&local_80,this_01);
    std::vector<Item_*,_std::allocator<Item_*>_>::_M_move_assign(&this->_minimal_items_to_complete);
    if ((ItemSource *)
        local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (ItemSource *)0x0) {
      operator_delete(local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&local_40,(initializer_list_t)ZEXT816(0),false,array);
    pvVar11 = nlohmann::
              basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)this_00,"requiredItems");
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(pvVar11,&local_40);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_40);
    ppIVar7 = (this->_minimal_items_to_complete).super__Vector_base<Item_*,_std::allocator<Item_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar14 = (this->_minimal_items_to_complete).
                    super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppIVar14 != ppIVar7; ppIVar14 = ppIVar14 + 1)
    {
      pIVar6 = *ppIVar14;
      pvVar11 = nlohmann::
                basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)this_00,"requiredItems");
      nlohmann::
      basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::emplace_back<std::__cxx11::string_const&>
                ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)pvVar11,&pIVar6->_name);
    }
  }
  return;
}

Assistant:

void WorldShuffler::randomize_items()
{
    this->place_fixed_items();
    this->init_item_pool();

    _solver.setup(_world.spawn_node(), _world.end_node(), _world.starting_inventory());

    bool explored_new_nodes = true;
    while(explored_new_nodes)
    {
        // Run a solver step to reach a "blocked" state where something needs to be placed in order to continue
        explored_new_nodes = _solver.run_until_blocked();

        // Update the table of spheres to have accurate data on when an item source was first considered during
        // generation, which is then used to evaluate prices by "logical distance" to starting point
        for(ItemSource* source : _solver.reachable_item_sources())
            if(!_item_source_spheres.count(source))
                _item_source_spheres[source] = _current_sphere;

        // Place all "scheduled" item placements, which correspond to "itemPlacedWhenCrossing" attributes of WorldPaths
        // solver encountered during last step
        for(auto& [item, item_sources] : _solver.scheduled_item_placements())
            this->place_item_randomly(item, item_sources);

        // Place one or several key items in order to open a blocked path
        this->open_random_blocked_path();

        // Item sources changed, force the solver to update its inventory
        _solver.update_current_inventory();

        _current_sphere += 1;
    }

    // Place the remaining items from the item pool in the remaining sources
    this->place_remaining_items();

    // Analyse items required to complete the seed
    Json& debug_log = _solver.debug_log();
    if(!_options.archipelago_world())
    {
        _minimal_items_to_complete = _solver.find_minimal_inventory();
        debug_log["requiredItems"] = Json::array();
        for(Item* item : _minimal_items_to_complete)
            debug_log["requiredItems"].emplace_back(item->name());
    }
}